

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O1

void lzham::vector<lzham::adaptive_bit_model>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  adaptive_bit_model *pSrc;
  long lVar1;
  
  if (num != 0) {
    lVar1 = (ulong)num * 2;
    do {
      adaptive_bit_model::adaptive_bit_model
                ((adaptive_bit_model *)pDst_void,(adaptive_bit_model *)pSrc_void);
      pSrc_void = (void *)((long)pSrc_void + 2);
      pDst_void = (void *)((long)pDst_void + 2);
      lVar1 = lVar1 + -2;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }